

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslcertificate.cpp
# Opt level: O1

QList<QSslCertificate> *
QSslCertificate::fromData
          (QList<QSslCertificate> *__return_storage_ptr__,QByteArray *data,EncodingFormat format)

{
  QTlsBackend *pQVar1;
  code *pcVar2;
  QLoggingCategory *pQVar3;
  
  pQVar1 = QTlsBackend::activeOrAnyBackend();
  if (pQVar1 == (QTlsBackend *)0x0) {
    pQVar3 = QtPrivateLogging::lcSsl();
    if (((pQVar3->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
      fromData((QSslCertificate *)pQVar3);
    }
  }
  else {
    pcVar2 = (code *)(**(code **)(*(long *)pQVar1 + 0xe8 + (ulong)(format != Pem) * 8))(pQVar1);
    if (pcVar2 != (code *)0x0) {
      (*pcVar2)(__return_storage_ptr__,data,0xffffffff);
      return __return_storage_ptr__;
    }
    pQVar3 = QtPrivateLogging::lcSsl();
    if (((pQVar3->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
      fromData((QSslCertificate *)pQVar3);
    }
  }
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QSslCertificate *)0x0;
  (__return_storage_ptr__->d).size = 0;
  return __return_storage_ptr__;
}

Assistant:

QList<QSslCertificate> QSslCertificate::fromData(const QByteArray &data, QSsl::EncodingFormat format)
{
    const auto *tlsBackend = QTlsBackend::activeOrAnyBackend();
    if (!tlsBackend) {
        qCWarning(lcSsl, "No TLS backend is available");
        return {};
    }

    auto reader = format == QSsl::Pem ? tlsBackend->X509PemReader() : tlsBackend->X509DerReader();
    if (!reader) {
        qCWarning(lcSsl, "The available TLS backend does not support reading PEM/DER");
        return {};
    }

    return reader(data, -1);
}